

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_hom.cxx
# Opt level: O1

void __thiscall xray_re::xr_level_hom::save(xr_level_hom *this,xr_writer *w)

{
  xr_writer::w_raw_chunk(w,0,&HOM_VERSION,4,false);
  xr_writer::open_chunk(w,1);
  if ((ulong)this->m_num_polys != 0) {
    (*w->_vptr_xr_writer[2])(w,this->m_polys,(ulong)this->m_num_polys * 0x28);
  }
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_level_hom::save(xr_writer& w) const
{
	w.w_chunk<uint32_t>(HOM_CHUNK_VERSION, HOM_VERSION);
	w.open_chunk(HOM_CHUNK_POLYGONS);
	w.w_cseq(m_num_polys, m_polys);
	w.close_chunk();
}